

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O2

void column_test_boundary_z5_operators<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
               (vector<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                *matrix)

{
  bool bVar1;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_00;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_01;
  initializer_list<std::pair<unsigned_int,_unsigned_int>_> __l_02;
  vector<unsigned_int,_std::allocator<unsigned_int>_> veccont;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_450;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  col3;
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  local_3f8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  col4;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  col2;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_348;
  Column_settings settings;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  col1;
  char *local_2c0;
  char *local_2b8;
  undefined1 *local_2b0;
  undefined1 *local_2a8;
  char *local_2a0;
  char *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  undefined1 *local_180;
  undefined1 *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  undefined1 *local_150;
  undefined1 *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  col0;
  
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Gudhi::persistence_fields::Zp_field_operators<unsigned_int,_void>::Zp_field_operators
            (&settings.operators,5);
  col1.super_Row_access_option.columnIndex_ = 0;
  col1.super_Row_access_option._4_4_ = 4;
  col1.super_Row_access_option.rows_._0_4_ = 1;
  col1.super_Row_access_option.rows_._4_4_ = 2;
  col1.super_Column_dimension_option.dim_ = 2;
  col1._20_4_ = 1;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 5;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 1;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x100000006;
  __l._M_len = 5;
  __l._M_array = (iterator)&col1;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col2,__l,(allocator_type *)&col3);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)&col0,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col2,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&col2);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  _add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)(matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,&col0);
  col1.super_Column_dimension_option.dim_ = 0;
  col1._20_4_ = 0;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 1;
  col1.super_Row_access_option.columnIndex_ = 0;
  col1.super_Row_access_option._4_4_ = 4;
  col1.super_Row_access_option.rows_._0_4_ = 1;
  col1.super_Row_access_option.rows_._4_4_ = 3;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col1);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x386);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col3,&veccont);
  col2.super_Row_access_option.columnIndex_._0_1_ = bVar1;
  col2.super_Row_access_option.rows_._0_4_ = 0;
  col2.super_Row_access_option.rows_._4_4_ = 0;
  col2.super_Column_dimension_option.dim_ = 0;
  col2._20_4_ = 0;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&col4;
  col4.super_Row_access_option._0_8_ = anon_var_dwarf_b9fe5;
  col4.super_Row_access_option.rows_._0_4_ = 0x1bc639;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col1.super_Row_access_option.rows_._0_4_ = (uint)col1.super_Row_access_option.rows_ & 0xffffff00;
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208390;
  col1.super_Column_dimension_option.dim_ = 0x210148;
  col1._20_4_ = 0;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col2.super_Column_dimension_option);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&col3);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x388);
  col1.super_Row_access_option.rows_._0_4_ = (uint)col1.super_Row_access_option.rows_ & 0xffffff00;
  col1.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208420;
  col1.super_Column_dimension_option.dim_ = 0x210148;
  col1._20_4_ = 0;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 0x1b52e6;
  col1.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 0;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  col2.super_Row_access_option._0_8_ =
       *(size_t *)
        ((long)&(((matrix->
                  super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->column_).
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl + 0x10);
  col3.super_Row_access_option.columnIndex_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col1,&local_d0,0x388,1,2,&col2,"matrix[0].size()",&col3,"4");
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_._0_4_ = 1;
  col2.super_Row_access_option.rows_._4_4_ = 3;
  col2.super_Column_dimension_option.dim_ = 2;
  col2._20_4_ = 4;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 5;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 4;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x400000006;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col2;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&col3,__l_00,(allocator_type *)&col4);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)&col1,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&col3);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  _add<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 1),&col1);
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,0,0);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x38f);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 1,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&veccont);
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar1;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x1bc64d;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x1bc67d;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208390;
  col2.super_Column_dimension_option.dim_ = 0x210148;
  col2._20_4_ = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_3f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&col4);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x391);
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208420;
  col2.super_Column_dimension_option.dim_ = 0x210148;
  col2._20_4_ = 0;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 0x1b52e6;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 0;
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  col3.super_Row_access_option._0_8_ =
       *(size_t *)
        ((long)&(matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1].column_.
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl + 0x10);
  col4.super_Row_access_option._0_8_ = col4.super_Row_access_option._0_8_ & 0xffffffff00000000;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col2,&local_130,0x391,1,2,&col3,"matrix[1].size()",&col4,"0");
  col2.super_Row_access_option.columnIndex_ = 4;
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((Field_element *)&col2,&col1,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 4);
  col2.super_Column_dimension_option.dim_ = 0;
  col2._20_4_ = 0;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 4;
  col2.super_Row_access_option.columnIndex_ = 0;
  col2.super_Row_access_option._4_4_ = 1;
  col2.super_Row_access_option.rows_._0_4_ = 4;
  col2.super_Row_access_option.rows_._4_4_ = 2;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col2);
  local_140 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_138 = "";
  local_150 = &boost::unit_test::basic_cstring<char_const>::null;
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_140,0x397);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 4,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,&veccont);
  col3.super_Row_access_option.columnIndex_._0_1_ = bVar1;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x1bc691;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0x1bc6c1;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208390;
  col2.super_Column_dimension_option.dim_ = 0x210148;
  col2._20_4_ = 0;
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_3f8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col3.super_Column_dimension_option);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&col4);
  local_170 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_168 = "";
  local_180 = &boost::unit_test::basic_cstring<char_const>::null;
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_170,0x399);
  col2.super_Row_access_option.rows_._0_4_ = (uint)col2.super_Row_access_option.rows_ & 0xffffff00;
  col2.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208420;
  col2.super_Column_dimension_option.dim_ = 0x210148;
  col2._20_4_ = 0;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 0x1b52e6;
  col2.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 0;
  local_190 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_188 = "";
  col3.super_Row_access_option._0_8_ =
       *(size_t *)
        ((long)&(matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[4].column_.
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl + 0x10);
  col4.super_Row_access_option.columnIndex_ = 4;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col2,&local_190,0x399,1,2,&col3,"matrix[4].size()",&col4,"4");
  col3.super_Row_access_option.columnIndex_ = 0;
  col3.super_Row_access_option._4_4_ = 0;
  col3.super_Row_access_option.rows_._0_4_ = 0;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 0;
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)&col2,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&col3,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base((_Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                   *)&col3);
  col3.super_Row_access_option.columnIndex_ = 3;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((Field_element *)&col3,&col2,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5);
  col3.super_Column_dimension_option.dim_ = 0;
  col3._20_4_ = 1;
  col3.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 1;
  col3.super_Row_access_option.columnIndex_ = 4;
  col3.super_Row_access_option._4_4_ = 2;
  col3.super_Row_access_option.rows_._0_4_ = 1;
  col3.super_Row_access_option.rows_._4_4_ = 0;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col3);
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1a0,0x39f);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f8,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 5,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f8,&veccont
                         );
  col4.super_Row_access_option.columnIndex_._0_1_ = bVar1;
  col4.super_Row_access_option.rows_._0_4_ = 0;
  col4.super_Row_access_option.rows_._4_4_ = 0;
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 0;
  col3.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_450;
  local_450._M_impl.super__Vector_impl_data._M_start = (pointer)0x1bc6d3;
  local_450._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1bc703;
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208390;
  col3.super_Column_dimension_option.dim_ = 0x210148;
  col3._20_4_ = 0;
  local_1c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1b8 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.super_Column_dimension_option);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_3f8);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x3a0);
  col3.super_Row_access_option.rows_._0_4_ = (uint)col3.super_Row_access_option.rows_ & 0xffffff00;
  col3.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208420;
  col3.super_Column_dimension_option.dim_ = 0x210148;
  col3._20_4_ = 0;
  col3.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 0x1b52e6;
  col3.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 0;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  col4.super_Row_access_option._0_8_ =
       *(size_t *)
        ((long)&(matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[5].column_.
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl + 0x10);
  local_3f8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3f8._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col3,&local_1f0,0x3a0,1,2,&col4,"matrix[5].size()",&local_3f8,"5");
  col4.super_Row_access_option.columnIndex_ = 0;
  col4.super_Row_access_option._4_4_ = 3;
  col4.super_Row_access_option.rows_._0_4_ = 2;
  col4.super_Row_access_option.rows_._4_4_ = 1;
  col4.super_Column_dimension_option.dim_ = 3;
  col4._20_4_ = 2;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 5;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 2;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x100000006;
  __l_01._M_len = 5;
  __l_01._M_array = (iterator)&col4;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_3f8,__l_01,(allocator_type *)&local_450);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)&col3,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_3f8,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_3f8);
  col4.super_Row_access_option.columnIndex_ = 3;
  Gudhi::persistence_matrix::
  _multiply_source_and_add_to_column<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((Field_element *)&col4,&col3,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 5);
  col4.super_Column_dimension_option.dim_ = 0;
  col4._20_4_ = 2;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 4;
  col4.super_Row_access_option.columnIndex_ = 3;
  col4.super_Row_access_option._4_4_ = 2;
  col4.super_Row_access_option.rows_._0_4_ = 4;
  col4.super_Row_access_option.rows_._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&col4);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3a5);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 5,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450,&veccont
                         );
  local_3f8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_3f8._M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_348;
  local_348._M_impl.super__Vector_impl_data._M_start = (pointer)0x1bc6d3;
  local_348._M_impl.super__Vector_impl_data._M_finish = (pointer)0x1bc703;
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208390;
  col4.super_Column_dimension_option.dim_ = 0x210148;
  col4._20_4_ = 0;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_218 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_450);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_230,0x3a7);
  col4.super_Row_access_option.rows_._0_4_ = (uint)col4.super_Row_access_option.rows_ & 0xffffff00;
  col4.super_Row_access_option._0_8_ = &PTR__lazy_ostream_00208420;
  col4.super_Column_dimension_option.dim_ = 0x210148;
  col4._20_4_ = 0;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._0_4_ = 0x1b52e6;
  col4.column_.
  super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
  ._M_impl._M_node.super__List_node_base._M_next._4_4_ = 0;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_248 = "";
  local_3f8._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        ((long)&(matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[5].column_.
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl + 0x10);
  local_450._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_450._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&col4,&local_250,0x3a7,1,2,&local_3f8,"matrix[5].size()",&local_450,"6");
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x300000000;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 1;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 2;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
  uStack_3e0._0_4_ = 3;
  uStack_3e0._4_4_ = 1;
  local_3d8 = 0x200000005;
  uStack_3d0 = 0x400000006;
  __l_02._M_len = 6;
  __l_02._M_array = (iterator)&local_3f8;
  std::
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::vector((vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
            *)&local_450,__l_02,(allocator_type *)&local_348);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
  ::
  List_column<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
            ((List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>
              *)&col4,(vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
                       *)&local_450,&settings);
  std::
  _Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  ::~_Vector_base(&local_450);
  local_3f8._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_3f8._M_impl.super__Vector_impl_data._M_start._4_4_,4);
  Gudhi::persistence_matrix::
  _multiply_target_and_add_to_column<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>,Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,true,true>>>>
            ((Field_element *)&local_3f8,&col4,
             (matrix->
             super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start + 3);
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
  uStack_3e0._0_4_ = 4;
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000003;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ = 4;
  local_3f8._M_impl.super__Vector_impl_data._M_finish._4_4_ = 1;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_assign_aux<unsigned_int_const*>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&veccont,&local_3f8);
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_260,0x3ad);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::get_content((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_348,
                (matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start + 3,
                (int)((ulong)((long)veccont.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)veccont.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2));
  bVar1 = std::operator==((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_348,&veccont
                         );
  local_450._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(local_450._M_impl.super__Vector_impl_data._M_start._1_7_,bVar1);
  local_450._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_450._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_3e0 = &local_280;
  local_280 = "matrix[3].get_content(veccont.size()) == veccont";
  local_278 = "";
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       (uint)local_3f8._M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00208390;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x210148;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_288 = "";
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_450._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_348);
  local_2a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_298 = "";
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2a0,0x3af);
  local_3f8._M_impl.super__Vector_impl_data._M_finish._0_4_ =
       (uint)local_3f8._M_impl.super__Vector_impl_data._M_finish & 0xffffff00;
  local_3f8._M_impl.super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00208420;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x210148;
  local_3f8._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  uStack_3e0._0_4_ = 0x1b52e6;
  uStack_3e0._4_4_ = 0;
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_2b8 = "";
  local_450._M_impl.super__Vector_impl_data._M_start =
       *(pointer *)
        ((long)&(matrix->
                super__Vector_base<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[3].column_.
                super__List_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>_*>_>
                ._M_impl + 0x10);
  local_348._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_348._M_impl.super__Vector_impl_data._M_start._4_4_,6);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
            (&local_3f8,&local_2c0,0x3af,1,2,&local_450,"matrix[3].size()",&local_348,"6");
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::~List_column(&col4);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::~List_column(&col3);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::~List_column(&col2);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::~List_column(&col1);
  Gudhi::persistence_matrix::
  List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_true,_true>_>_>
  ::~List_column(&col0);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&settings.operators.inverse_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&veccont.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void column_test_boundary_z5_operators(std::vector<Column>& matrix) {
  using cont = std::vector<std::pair<unsigned int, typename Column::Field_element> >;

  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings(5);

  const Column col0(cont{{0, 4}, {1, 2}, {2, 1}, {5, 1}, {6, 1}}, &settings);
  matrix[0] += col0;

  veccont = {0, 4, 1, 3, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 4);
  }

  const Column col1(cont{{0, 1}, {1, 3}, {2, 4}, {5, 4}, {6, 4}}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(4, col1);
  veccont = {0, 1, 4, 2, 0, 0, 4};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 4);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {4, 2, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  // this = this + column * v
  const Column col3(cont{{0, 3}, {2, 1}, {3, 2}, {5, 2}, {6, 1}}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 6);
  }
  // this = v * this + column
  const Column col4(cont{{0, 3}, {1, 2}, {2, 4}, {3, 1}, {5, 2}, {6, 4}}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {3, 2, 4, 1, 0, 2, 4};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 6);
  }
}